

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

bool QApplication::isEffectEnabled(UIEffect effect)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  long in_FS_OFFSET;
  QColormap local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (QCoreApplication::self == 0) {
    isEffectEnabled();
    bVar2 = false;
  }
  else {
    QColormap::instance((int)&local_20);
    iVar1 = QColormap::depth(&local_20);
    if (iVar1 < 0x10) {
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
      if ((QApplicationPrivate::enabledAnimations & 1U) != 0) {
        if (effect < (UI_AnimateToolBox|UI_AnimateMenu)) {
          uVar3 = *(uint *)(&DAT_0066fb40 + (ulong)effect * 4);
        }
        uVar3 = (uint)((uVar3 & QApplicationPrivate::enabledAnimations) != 0);
      }
    }
    bVar2 = SUB41(uVar3,0);
    QColormap::~QColormap(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QApplication::isEffectEnabled(Qt::UIEffect effect)
{
    CHECK_QAPP_INSTANCE(false)
    return QColormap::instance().depth() >= 16
           && (QApplicationPrivate::enabledAnimations & QPlatformTheme::GeneralUiEffect)
           && (QApplicationPrivate::enabledAnimations & uiEffectToFlag(effect));
}